

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_field_gens.cc
# Opt level: O0

unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
 __thiscall
google::protobuf::compiler::java::anon_unknown_16::CreateImmutableLiteGenerator
          (anon_unknown_16 *this,FieldDescriptor *field,int messageBitIndex,Context *context)

{
  bool bVar1;
  JavaType JVar2;
  Descriptor *descriptor;
  unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator>_>
  local_90;
  unique_ptr<google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator>_>
  local_88;
  unique_ptr<google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator>_>
  local_80;
  unique_ptr<google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator>_>
  local_78;
  unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator>_>
  local_70;
  unique_ptr<google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator>_>
  local_68;
  unique_ptr<google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator>_>
  local_60;
  unique_ptr<google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator>_>
  local_58;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator>_>
  local_50;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator>_>
  local_48;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator>_>
  local_40;
  unique_ptr<google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator>_>
  local_38;
  unique_ptr<google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator>_>
  local_30;
  Context *local_28;
  Context *context_local;
  FieldDescriptor *pFStack_18;
  int messageBitIndex_local;
  FieldDescriptor *field_local;
  
  local_28 = context;
  context_local._4_4_ = messageBitIndex;
  pFStack_18 = field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    JVar2 = GetJavaType(pFStack_18);
    if (JVar2 == JAVATYPE_STRING) {
      std::
      make_unique<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                ((FieldDescriptor **)&local_48,(int *)&stack0xffffffffffffffe8,
                 (Context **)((long)&context_local + 4));
      std::
      unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
      ::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator>,void>
                ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                  *)this,&local_48);
      std::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator>_>
      ::~unique_ptr(&local_48);
    }
    else if (JVar2 == JAVATYPE_ENUM) {
      std::
      make_unique<google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                ((FieldDescriptor **)&local_40,(int *)&stack0xffffffffffffffe8,
                 (Context **)((long)&context_local + 4));
      std::
      unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
      ::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator>,void>
                ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                  *)this,&local_40);
      std::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator>_>
      ::~unique_ptr(&local_40);
    }
    else if (JVar2 == JAVATYPE_MESSAGE) {
      descriptor = FieldDescriptor::message_type(pFStack_18);
      bVar1 = IsMapEntry(descriptor);
      if (bVar1) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_30,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_30);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator>_>
        ::~unique_ptr(&local_30);
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_38,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_38);
        std::
        unique_ptr<google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator>_>
        ::~unique_ptr(&local_38);
      }
    }
    else {
      std::
      make_unique<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                ((FieldDescriptor **)&local_50,(int *)&stack0xffffffffffffffe8,
                 (Context **)((long)&context_local + 4));
      std::
      unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
      ::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator>,void>
                ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                  *)this,&local_50);
      std::
      unique_ptr<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator>_>
      ::~unique_ptr(&local_50);
    }
  }
  else {
    bVar1 = IsRealOneof(pFStack_18);
    if (bVar1) {
      JVar2 = GetJavaType(pFStack_18);
      if (JVar2 == JAVATYPE_STRING) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_68,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_68);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator>_>
        ::~unique_ptr(&local_68);
      }
      else if (JVar2 == JAVATYPE_ENUM) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_60,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_60);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator>_>
        ::~unique_ptr(&local_60);
      }
      else if (JVar2 == JAVATYPE_MESSAGE) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_58,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_58);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator>_>
        ::~unique_ptr(&local_58);
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_70);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator>_>
        ::~unique_ptr(&local_70);
      }
    }
    else {
      JVar2 = GetJavaType(pFStack_18);
      if (JVar2 == JAVATYPE_STRING) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_88,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_88);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator>_>
        ::~unique_ptr(&local_88);
      }
      else if (JVar2 == JAVATYPE_ENUM) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_80,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_80);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator>_>
        ::~unique_ptr(&local_80);
      }
      else if (JVar2 == JAVATYPE_MESSAGE) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_78,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_78);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator>_>
        ::~unique_ptr(&local_78);
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator,google::protobuf::FieldDescriptor_const*&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_90,(int *)&stack0xffffffffffffffe8,
                   (Context **)((long)&context_local + 4));
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
        ::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator>,void>
                  ((unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>>
                    *)this,&local_90);
        std::
        unique_ptr<google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator>_>
        ::~unique_ptr(&local_90);
      }
    }
  }
  return (__uniq_ptr_data<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ImmutableFieldLiteGenerator> CreateImmutableLiteGenerator(
    const FieldDescriptor* field, int messageBitIndex, Context* context) {
  if (field->is_repeated()) {
    switch (GetJavaType(field)) {
      case JAVATYPE_MESSAGE:
        if (IsMapEntry(field->message_type())) {
          return std::make_unique<ImmutableMapFieldLiteGenerator>(
              field, messageBitIndex, context);
        } else {
          return std::make_unique<RepeatedImmutableMessageFieldLiteGenerator>(
              field, messageBitIndex, context);
        }
      case JAVATYPE_ENUM:
        return std::make_unique<RepeatedImmutableEnumFieldLiteGenerator>(
            field, messageBitIndex, context);
      case JAVATYPE_STRING:
        return std::make_unique<RepeatedImmutableStringFieldLiteGenerator>(
            field, messageBitIndex, context);
      default:
        return std::make_unique<RepeatedImmutablePrimitiveFieldLiteGenerator>(
            field, messageBitIndex, context);
    }
  } else {
    if (IsRealOneof(field)) {
      switch (GetJavaType(field)) {
        case JAVATYPE_MESSAGE:
          return std::make_unique<ImmutableMessageOneofFieldLiteGenerator>(
              field, messageBitIndex, context);
        case JAVATYPE_ENUM:
          return std::make_unique<ImmutableEnumOneofFieldLiteGenerator>(
              field, messageBitIndex, context);
        case JAVATYPE_STRING:
          return std::make_unique<ImmutableStringOneofFieldLiteGenerator>(
              field, messageBitIndex, context);
        default:
          return std::make_unique<ImmutablePrimitiveOneofFieldLiteGenerator>(
              field, messageBitIndex, context);
      }
    } else {
      switch (GetJavaType(field)) {
        case JAVATYPE_MESSAGE:
          return std::make_unique<ImmutableMessageFieldLiteGenerator>(
              field, messageBitIndex, context);
        case JAVATYPE_ENUM:
          return std::make_unique<ImmutableEnumFieldLiteGenerator>(
              field, messageBitIndex, context);
        case JAVATYPE_STRING:
          return std::make_unique<ImmutableStringFieldLiteGenerator>(
              field, messageBitIndex, context);
        default:
          return std::make_unique<ImmutablePrimitiveFieldLiteGenerator>(
              field, messageBitIndex, context);
      }
    }
  }
}